

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O0

void cjson_add_raw_should_add_raw(void)

{
  cJSON *object;
  cJSON *pcVar1;
  cJSON *raw;
  cJSON *root;
  
  object = cJSON_CreateObject();
  cJSON_AddRawToObject(object,"raw","{}");
  pcVar1 = cJSON_GetObjectItemCaseSensitive(object,"raw");
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x145);
  }
  UnityAssertEqualNumber((long)pcVar1->type,0x80,(char *)0x0,0x146,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualString(pcVar1->valuestring,"{}",(char *)0x0,0x147);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_raw_should_add_raw(void)
{
    cJSON *root = cJSON_CreateObject();
    cJSON *raw = NULL;

    cJSON_AddRawToObject(root, "raw", "{}");

    TEST_ASSERT_NOT_NULL(raw = cJSON_GetObjectItemCaseSensitive(root, "raw"));
    TEST_ASSERT_EQUAL_INT(raw->type, cJSON_Raw);
    TEST_ASSERT_EQUAL_STRING(raw->valuestring, "{}");

    cJSON_Delete(root);
}